

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# saigDup.c
# Opt level: O3

Abc_Cex_t * Saig_ManExtendCex(Aig_Man_t *pAig,Abc_Cex_t *p)

{
  undefined1 *puVar1;
  byte bVar2;
  void *pvVar3;
  void **ppvVar4;
  bool bVar5;
  uint uVar6;
  int iVar7;
  Abc_Cex_t *pAVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  Vec_Ptr_t *pVVar12;
  int iVar13;
  ulong uVar14;
  
  uVar14 = 0;
  pAVar8 = Abc_CexAlloc(0,pAig->nObjs[2],p->iFrame + 1);
  iVar13 = p->iFrame;
  pAVar8->iPo = p->iPo;
  pAVar8->iFrame = iVar13;
  Aig_ManCleanMarkB(pAig);
  puVar1 = &pAig->pConst1->field_0x18;
  *(ulong *)puVar1 = *(ulong *)puVar1 | 0x20;
  if (0 < pAig->nRegs) {
    uVar10 = 0;
    do {
      uVar6 = pAig->nTruePis + uVar10;
      if (((int)uVar6 < 0) || (pAig->vCis->nSize <= (int)uVar6)) goto LAB_006e80dc;
      pvVar3 = pAig->vCis->pArray[uVar6];
      uVar6 = uVar10 + 1;
      uVar14 = (ulong)uVar6;
      *(ulong *)((long)pvVar3 + 0x18) =
           *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
           (ulong)(((uint)(&p[1].iPo)[uVar10 >> 5] >> ((byte)uVar10 & 0x1f) & 1) << 5);
      uVar10 = uVar6;
    } while ((int)uVar6 < pAig->nRegs);
  }
  iVar13 = (int)uVar14;
  if (-1 < p->iFrame) {
    iVar7 = 0;
    while( true ) {
      if (0 < pAig->nTruePis) {
        lVar11 = 0;
        do {
          if (pAig->vCis->nSize <= lVar11) goto LAB_006e80dc;
          pvVar3 = pAig->vCis->pArray[lVar11];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((uint)(&p[1].iPo)[(int)(uVar14 + lVar11) >> 5] >>
                        ((byte)(uVar14 + lVar11) & 0x1f) & 1) << 5);
          lVar11 = lVar11 + 1;
        } while (lVar11 < pAig->nTruePis);
        uVar14 = (ulong)(uint)((int)uVar14 + (int)lVar11);
      }
      iVar13 = (int)uVar14;
      pVVar12 = pAig->vCis;
      iVar9 = pVVar12->nSize;
      if (0 < iVar9) {
        ppvVar4 = pVVar12->pArray;
        lVar11 = 0;
        do {
          if ((*(byte *)((long)ppvVar4[lVar11] + 0x18) & 0x20) != 0) {
            iVar9 = pAig->nObjs[2] * iVar7 + (int)lVar11;
            (&pAVar8[1].iPo)[iVar9 >> 5] = (&pAVar8[1].iPo)[iVar9 >> 5] | 1 << ((byte)iVar9 & 0x1f);
            iVar9 = pVVar12->nSize;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < iVar9);
      }
      pVVar12 = pAig->vObjs;
      if (0 < pVVar12->nSize) {
        lVar11 = 0;
        do {
          pvVar3 = pVVar12->pArray[lVar11];
          if ((pvVar3 != (void *)0x0) &&
             (0xfffffffd < ((uint)*(ulong *)((long)pvVar3 + 0x18) & 7) - 7)) {
            *(ulong *)((long)pvVar3 + 0x18) =
                 *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
                 (ulong)((((uint)*(ulong *)((long)pvVar3 + 0x10) ^
                          *(uint *)((*(ulong *)((long)pvVar3 + 0x10) & 0xfffffffffffffffe) + 0x18)
                          >> 5) & ((uint)*(ulong *)((long)pvVar3 + 8) ^
                                  *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) +
                                           0x18) >> 5) & 1) << 5);
            pVVar12 = pAig->vObjs;
          }
          lVar11 = lVar11 + 1;
        } while (lVar11 < pVVar12->nSize);
      }
      pVVar12 = pAig->vCos;
      if (0 < pVVar12->nSize) {
        lVar11 = 0;
        do {
          pvVar3 = pVVar12->pArray[lVar11];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)(((int)*(ulong *)((long)pvVar3 + 8) << 5 ^
                       *(uint *)((*(ulong *)((long)pvVar3 + 8) & 0xfffffffffffffffe) + 0x18)) & 0x20
                      );
          lVar11 = lVar11 + 1;
          pVVar12 = pAig->vCos;
        } while (lVar11 < pVVar12->nSize);
      }
      iVar9 = p->iFrame;
      if (iVar7 == iVar9) break;
      if (0 < pAig->nRegs) {
        iVar9 = 0;
        do {
          uVar10 = pAig->nTruePos + iVar9;
          if (((((int)uVar10 < 0) || (pAig->vCos->nSize <= (int)uVar10)) ||
              (uVar6 = pAig->nTruePis + iVar9, (int)uVar6 < 0)) || (pAig->vCis->nSize <= (int)uVar6)
             ) goto LAB_006e80dc;
          pvVar3 = pAig->vCis->pArray[uVar6];
          *(ulong *)((long)pvVar3 + 0x18) =
               *(ulong *)((long)pvVar3 + 0x18) & 0xffffffffffffffdf |
               (ulong)((uint)*(undefined8 *)((long)pAig->vCos->pArray[uVar10] + 0x18) & 0x20);
          iVar9 = iVar9 + 1;
        } while (iVar9 < pAig->nRegs);
        iVar9 = p->iFrame;
      }
      bVar5 = iVar9 <= iVar7;
      iVar7 = iVar7 + 1;
      if (bVar5) break;
    }
  }
  if (iVar13 != p->nBits) {
    __assert_fail("iBit == p->nBits",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/saig/saigDup.c"
                  ,0x1a1,"Abc_Cex_t *Saig_ManExtendCex(Aig_Man_t *, Abc_Cex_t *)");
  }
  iVar13 = p->iPo;
  if ((-1 < (long)iVar13) && (iVar13 < pAig->vCos->nSize)) {
    bVar2 = *(byte *)((long)pAig->vCos->pArray[iVar13] + 0x18);
    Aig_ManCleanMarkB(pAig);
    if ((bVar2 & 0x20) == 0) {
      puts("Saig_ManExtendCex(): The counter-example is invalid!!!");
    }
    return pAVar8;
  }
LAB_006e80dc:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecPtr.h"
                ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
}

Assistant:

Abc_Cex_t * Saig_ManExtendCex( Aig_Man_t * pAig, Abc_Cex_t * p )
{
    Abc_Cex_t * pNew;
    Aig_Obj_t * pObj, * pObjRi, * pObjRo;
    int RetValue, i, k, iBit = 0;
    // create new counter-example
    pNew = Abc_CexAlloc( 0, Aig_ManCiNum(pAig), p->iFrame + 1 );
    pNew->iPo = p->iPo;
    pNew->iFrame = p->iFrame;
    // simulate the AIG
    Aig_ManCleanMarkB(pAig);
    Aig_ManConst1(pAig)->fMarkB = 1;
    Saig_ManForEachLo( pAig, pObj, i )
        pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
    for ( i = 0; i <= p->iFrame; i++ )
    {
        Saig_ManForEachPi( pAig, pObj, k )
            pObj->fMarkB = Abc_InfoHasBit(p->pData, iBit++);
        ///////// write PI+LO values ////////////
        Aig_ManForEachCi( pAig, pObj, k )
            if ( pObj->fMarkB )
                Abc_InfoSetBit(pNew->pData, Aig_ManCiNum(pAig)*i + k);
        /////////////////////////////////////////
        Aig_ManForEachNode( pAig, pObj, k )
            pObj->fMarkB = (Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj)) & 
                           (Aig_ObjFanin1(pObj)->fMarkB ^ Aig_ObjFaninC1(pObj));
        Aig_ManForEachCo( pAig, pObj, k )
            pObj->fMarkB = Aig_ObjFanin0(pObj)->fMarkB ^ Aig_ObjFaninC0(pObj);
        if ( i == p->iFrame )
            break;
        Saig_ManForEachLiLo( pAig, pObjRi, pObjRo, k )
            pObjRo->fMarkB = pObjRi->fMarkB;
    }
    assert( iBit == p->nBits );
    RetValue = Aig_ManCo(pAig, p->iPo)->fMarkB;
    Aig_ManCleanMarkB(pAig);
    if ( RetValue == 0 )
        printf( "Saig_ManExtendCex(): The counter-example is invalid!!!\n" );
    return pNew;
}